

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

ExpressionValue * __thiscall ExpressionValue::operator~(ExpressionValue *this)

{
  ExpressionValue *result;
  ExpressionValue *in_RDI;
  
  (in_RDI->strValue)._value._M_dataplus._M_p = (pointer)&(in_RDI->strValue)._value.field_2;
  (in_RDI->strValue)._value._M_string_length = 0;
  (in_RDI->strValue)._value.field_2._M_local_buf[0] = '\0';
  in_RDI->type = Invalid;
  (in_RDI->field_1).intValue = 0;
  if (this->type == Integer) {
    in_RDI->type = Integer;
    (in_RDI->field_1).intValue = ~(this->field_1).intValue;
  }
  return in_RDI;
}

Assistant:

ExpressionValue ExpressionValue::operator~() const
{
	ExpressionValue result;

	if (isInt())
	{
		result.type = ExpressionValueType::Integer;
		result.intValue = ~intValue;
	}

	return result;
}